

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertFloatSpecial
               (UNITY_FLOAT actual,char *msg,UNITY_UINT lineNumber,UNITY_FLOAT_TRAIT_T style)

{
  int iVar1;
  int iVar2;
  bool local_6a;
  bool local_69;
  ulong local_60;
  UNITY_INT trait_index;
  UNITY_INT is_trait;
  UNITY_INT should_be_trait;
  char *trait_names [4];
  UNITY_FLOAT_TRAIT_T style_local;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_FLOAT actual_local;
  
  trait_names[0] = "Negative Infinity";
  trait_names[1] = "NaN";
  trait_names[2] = "Determinate";
  trait_index = (UNITY_INT)(int)(uint)((style & UNITY_FLOAT_IS_INF) == UNITY_FLOAT_IS_NOT_INF);
  local_60 = (ulong)(style >> 1);
  trait_names[3]._4_4_ = style;
  if ((Unity.CurrentTestFailed != 0) || (Unity.CurrentTestIgnored != 0)) {
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  switch(style) {
  case UNITY_FLOAT_IS_NOT_INF:
  case UNITY_FLOAT_IS_INF:
    iVar2 = 1;
    if ((int)actual < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(actual) == INFINITY) {
      iVar1 = iVar2;
    }
    local_69 = iVar1 != 0 && 0.0 < actual;
    trait_index = (UNITY_INT)(int)(uint)local_69;
    break;
  case UNITY_FLOAT_IS_NOT_NEG_INF:
  case UNITY_FLOAT_IS_NEG_INF:
    iVar2 = 1;
    if ((int)actual < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(actual) == INFINITY) {
      iVar1 = iVar2;
    }
    local_6a = iVar1 != 0 && actual < 0.0;
    trait_index = (UNITY_INT)(int)(uint)local_6a;
    break;
  case UNITY_FLOAT_IS_NOT_NAN:
  case UNITY_FLOAT_IS_NAN:
    trait_index = (UNITY_INT)(int)(uint)NAN(actual);
    break;
  case UNITY_FLOAT_IS_NOT_DET:
  case UNITY_FLOAT_IS_DET:
    iVar2 = 1;
    if ((int)actual < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(actual) == INFINITY) {
      iVar1 = iVar2;
    }
    trait_index = (UNITY_INT)(int)(uint)(iVar1 == 0 && !NAN(actual));
    break;
  default:
    local_60 = 0;
  }
  if (trait_index != ((ulong)style & 1)) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    if ((style & UNITY_FLOAT_IS_INF) == UNITY_FLOAT_IS_NOT_INF) {
      UnityPrint("Not ");
    }
    UnityPrint(trait_names[local_60 - 1]);
    UnityPrint(" Was ");
    UnityPrintFloat(actual);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityAssertFloatSpecial(const UNITY_FLOAT actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber,
                             const UNITY_FLOAT_TRAIT_T style)
{
    const char* trait_names[] = {UnityStrInf, UnityStrNegInf, UnityStrNaN, UnityStrDet};
    UNITY_INT should_be_trait = ((UNITY_INT)style & 1);
    UNITY_INT is_trait        = !should_be_trait;
    UNITY_INT trait_index     = (UNITY_INT)(style >> 1);

    RETURN_IF_FAIL_OR_IGNORE;

    switch (style)
    {
        case UNITY_FLOAT_IS_INF:
        case UNITY_FLOAT_IS_NOT_INF:
            is_trait = isinf(actual) && (actual > 0);
            break;
        case UNITY_FLOAT_IS_NEG_INF:
        case UNITY_FLOAT_IS_NOT_NEG_INF:
            is_trait = isinf(actual) && (actual < 0);
            break;

        case UNITY_FLOAT_IS_NAN:
        case UNITY_FLOAT_IS_NOT_NAN:
            is_trait = isnan(actual) ? 1 : 0;
            break;

        case UNITY_FLOAT_IS_DET: /* A determinate number is non infinite and not NaN. */
        case UNITY_FLOAT_IS_NOT_DET:
            is_trait = !isinf(actual) && !isnan(actual);
            break;

        default: /* including UNITY_FLOAT_INVALID_TRAIT */
            trait_index = 0;
            trait_names[0] = UnityStrInvalidFloatTrait;
            break;
    }

    if (is_trait != should_be_trait)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        if (!should_be_trait)
        {
            UnityPrint(UnityStrNot);
        }
        UnityPrint(trait_names[trait_index]);
        UnityPrint(UnityStrWas);
#ifndef UNITY_EXCLUDE_FLOAT_PRINT
        UnityPrintFloat((UNITY_DOUBLE)actual);
#else
        if (should_be_trait)
        {
            UnityPrint(UnityStrNot);
        }
        UnityPrint(trait_names[trait_index]);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}